

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<68UL> * __thiscall GF2::WW<68UL>::Reverse(WW<68UL> *this)

{
  bool val;
  bool val_00;
  WW<68UL> *in_RDI;
  bool save;
  size_t end;
  size_t start;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 0x44;
  for (local_10 = 0; local_10 + 1 < local_18; local_10 = local_10 + 1) {
    val = Test(in_RDI,local_10);
    val_00 = Test(in_RDI,local_18 - 1);
    Set(in_RDI,local_10,val_00);
    Set(in_RDI,local_18 - 1,val);
    local_18 = local_18 - 1;
  }
  return in_RDI;
}

Assistant:

WW& Reverse()
	{	
		for (size_t start = 0, end = _n; start + 1 < end; ++start, --end)
		{
			bool save = Test(start);
			Set(start, Test(end - 1));
			Set(end - 1, save);
		}
		return *this;
	}